

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strsv.c
# Opt level: O1

void strsv_(char *uplo,char *trans,char *diag,integer *n,real *a,integer *lda,real *x,integer *incx)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  real *prVar17;
  real *prVar18;
  float *pfVar19;
  int iVar20;
  long lVar21;
  float *pfVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  float fVar26;
  int local_3c [3];
  
  local_3c[0] = 0;
  cVar1 = *uplo;
  if ((cVar1 == 'L') || (cVar1 == 'U')) {
    if (((byte)*trans - 0x43 < 0x12) && ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) != 0)) {
      if ((*diag == 'N') || (*diag == 'U')) {
        iVar12 = *n;
        if (iVar12 < 0) {
          local_3c[0] = 4;
        }
        else {
          iVar11 = 1;
          if (1 < iVar12) {
            iVar11 = iVar12;
          }
          if (*lda < iVar11) {
            local_3c[0] = 6;
          }
          else if (*incx == 0) {
            local_3c[0] = 8;
          }
        }
      }
      else {
        local_3c[0] = 3;
      }
    }
    else {
      local_3c[0] = 2;
    }
  }
  else {
    local_3c[0] = 1;
  }
  if (local_3c[0] == 0) {
    uVar3 = *n;
    uVar10 = (ulong)uVar3;
    if (uVar10 != 0) {
      cVar2 = *diag;
      iVar12 = *incx;
      lVar16 = (long)iVar12;
      iVar20 = uVar3 - 1;
      iVar11 = 1 - iVar12 * iVar20;
      if (0 < lVar16) {
        iVar11 = 1;
      }
      if (*trans == 'N') {
        if (cVar1 == 'U') {
          if (iVar12 == 1) {
            if (0 < (int)uVar3) {
              lVar16 = uVar10 * 4;
              do {
                lVar16 = lVar16 + -4;
                uVar7 = uVar10 - 1;
                fVar26 = x[uVar10 - 1];
                if ((fVar26 != 0.0) || (NAN(fVar26))) {
                  if (cVar2 == 'N') {
                    x[uVar7] = fVar26 / a[(int)uVar7 * (*lda + 1)];
                  }
                  if (1 < (long)uVar10) {
                    iVar12 = *lda;
                    fVar26 = x[uVar7];
                    uVar8 = uVar10;
                    do {
                      x[uVar8 - 2] = *(float *)((long)a + uVar8 * 4 + iVar12 * lVar16 + -8) *
                                     -fVar26 + x[uVar8 - 2];
                      uVar8 = uVar8 - 1;
                    } while (1 < (long)uVar8);
                  }
                }
                bVar5 = 1 < (long)uVar10;
                uVar10 = uVar7;
              } while (bVar5);
            }
          }
          else if (0 < (int)uVar3) {
            iVar14 = (uVar3 - 1) * iVar12 + iVar11;
            iVar11 = (uVar3 - 2) * iVar12 + iVar11;
            do {
              fVar26 = x[(long)iVar14 + -1];
              iVar6 = (int)uVar10;
              if ((fVar26 != 0.0) || (NAN(fVar26))) {
                if (cVar2 == 'N') {
                  x[(long)iVar14 + -1] = fVar26 / a[(*lda + 1) * (iVar6 + -1)];
                }
                if (1 < iVar6) {
                  iVar4 = *lda;
                  fVar26 = x[(long)iVar14 + -1];
                  uVar7 = uVar10;
                  iVar23 = iVar11;
                  do {
                    x[(long)iVar23 + -1] =
                         a[(long)iVar20 * (long)iVar4 + (uVar7 - 2)] * -fVar26 +
                         x[(long)iVar23 + -1];
                    uVar7 = uVar7 - 1;
                    iVar23 = iVar23 - iVar12;
                  } while (1 < (long)uVar7);
                }
              }
              uVar10 = uVar10 - 1;
              iVar14 = iVar14 - iVar12;
              iVar20 = iVar20 + -1;
              iVar11 = iVar11 - iVar12;
            } while (1 < iVar6);
          }
        }
        else if (iVar12 == 1) {
          if (0 < (int)uVar3) {
            prVar17 = a + 1;
            uVar8 = 1;
            lVar16 = 0;
            prVar18 = x;
            uVar7 = uVar10;
            do {
              uVar7 = uVar7 - 1;
              prVar18 = prVar18 + 1;
              fVar26 = x[uVar8 - 1];
              if ((fVar26 != 0.0) || (NAN(fVar26))) {
                if (cVar2 == 'N') {
                  x[uVar8 - 1] = fVar26 / a[((int)uVar8 + -1) * (*lda + 1)];
                }
                if (uVar8 < uVar10) {
                  iVar12 = *lda;
                  fVar26 = x[uVar8 - 1];
                  uVar9 = 0;
                  do {
                    prVar18[uVar9] =
                         *(float *)((long)prVar17 + uVar9 * 4 + iVar12 * lVar16) * -fVar26 +
                         prVar18[uVar9];
                    uVar9 = uVar9 + 1;
                  } while (uVar7 != uVar9);
                }
              }
              uVar8 = uVar8 + 1;
              prVar17 = prVar17 + 1;
              lVar16 = lVar16 + 4;
            } while (uVar8 != uVar10 + 1);
          }
        }
        else if (0 < (int)uVar3) {
          lVar15 = (long)iVar11;
          lVar21 = uVar10 + 1;
          pfVar19 = x + lVar15 + lVar16 + -1;
          lVar24 = 1;
          iVar12 = 0;
          prVar17 = a;
          do {
            fVar26 = x[lVar15 + -1];
            if ((fVar26 != 0.0) || (NAN(fVar26))) {
              if (cVar2 == 'N') {
                x[lVar15 + -1] = fVar26 / a[(*lda + 1) * ((int)lVar24 + -1)];
              }
              if ((int)lVar24 < (int)uVar3) {
                iVar11 = *lda;
                fVar26 = x[lVar15 + -1];
                uVar7 = 1;
                pfVar22 = pfVar19;
                do {
                  *pfVar22 = prVar17[(long)iVar12 * (long)iVar11 + uVar7] * -fVar26 + *pfVar22;
                  uVar7 = uVar7 + 1;
                  pfVar22 = pfVar22 + lVar16;
                } while (uVar10 != uVar7);
              }
            }
            lVar15 = lVar15 + lVar16;
            lVar24 = lVar24 + 1;
            prVar17 = prVar17 + 1;
            iVar12 = iVar12 + 1;
            uVar10 = uVar10 - 1;
            pfVar19 = pfVar19 + lVar16;
          } while (lVar24 != lVar21);
        }
      }
      else if (cVar1 == 'U') {
        if (iVar12 == 1) {
          if (0 < (int)uVar3) {
            uVar7 = 1;
            lVar16 = 0;
            lVar15 = 0;
            do {
              fVar26 = x[uVar7 - 1];
              if (1 < uVar7) {
                lVar21 = 0;
                do {
                  fVar26 = fVar26 - *(float *)((long)a + lVar21 * 4 + *lda * lVar15) * x[lVar21];
                  lVar21 = lVar21 + 1;
                } while (lVar16 != lVar21);
              }
              if (cVar2 == 'N') {
                fVar26 = fVar26 / a[((int)uVar7 + -1) * (*lda + 1)];
              }
              x[uVar7 - 1] = fVar26;
              uVar7 = uVar7 + 1;
              lVar15 = lVar15 + 4;
              lVar16 = lVar16 + 1;
            } while (uVar7 != uVar10 + 1);
          }
        }
        else if (0 < (int)uVar3) {
          lVar21 = (long)iVar11;
          lVar15 = lVar21 + -1;
          uVar7 = 1;
          lVar24 = 0;
          lVar25 = 0;
          do {
            fVar26 = x[lVar21 + -1];
            if (1 < uVar7) {
              lVar13 = 0;
              pfVar19 = x + lVar15;
              do {
                fVar26 = fVar26 - *(float *)((long)a + lVar13 * 4 + *lda * lVar25) * *pfVar19;
                lVar13 = lVar13 + 1;
                pfVar19 = pfVar19 + lVar16;
              } while (lVar24 != lVar13);
            }
            if (cVar2 == 'N') {
              fVar26 = fVar26 / a[((int)uVar7 + -1) * (*lda + 1)];
            }
            x[lVar21 + -1] = fVar26;
            lVar21 = lVar21 + lVar16;
            uVar7 = uVar7 + 1;
            lVar25 = lVar25 + 4;
            lVar24 = lVar24 + 1;
          } while (uVar7 != uVar10 + 1);
        }
      }
      else if (iVar12 == 1) {
        if (0 < (int)uVar3) {
          lVar16 = uVar10 * 4;
          uVar7 = uVar10;
          do {
            lVar16 = lVar16 + -4;
            fVar26 = x[uVar7 - 1];
            if ((long)uVar7 < (long)uVar10) {
              uVar8 = uVar10;
              do {
                lVar15 = uVar8 * 4;
                lVar21 = uVar8 - 1;
                uVar8 = uVar8 - 1;
                fVar26 = fVar26 - *(float *)((long)a + lVar15 + *lda * lVar16 + -4) * x[lVar21];
              } while ((long)uVar7 < (long)uVar8);
            }
            uVar8 = uVar7 - 1;
            if (cVar2 == 'N') {
              fVar26 = fVar26 / a[(int)uVar8 * (*lda + 1)];
            }
            x[uVar8] = fVar26;
            bVar5 = 1 < (long)uVar7;
            uVar7 = uVar8;
          } while (bVar5);
        }
      }
      else if (0 < (int)uVar3) {
        iVar11 = iVar11 + (uVar3 - 1) * iVar12;
        lVar16 = uVar10 * 4;
        uVar7 = uVar10;
        iVar20 = iVar11;
        do {
          lVar16 = lVar16 + -4;
          fVar26 = x[(long)iVar20 + -1];
          if ((long)uVar7 < (long)uVar10) {
            uVar8 = uVar10;
            iVar14 = iVar11;
            do {
              lVar15 = uVar8 * 4;
              uVar8 = uVar8 - 1;
              fVar26 = fVar26 - *(float *)((long)a + lVar15 + *lda * lVar16 + -4) *
                                x[(long)iVar14 + -1];
              iVar14 = iVar14 - iVar12;
            } while ((long)uVar7 < (long)uVar8);
          }
          if (cVar2 == 'N') {
            fVar26 = fVar26 / a[((int)uVar7 + -1) * (*lda + 1)];
          }
          x[(long)iVar20 + -1] = fVar26;
          iVar20 = iVar20 - iVar12;
          bVar5 = 1 < (long)uVar7;
          uVar7 = uVar7 - 1;
        } while (bVar5);
      }
    }
  }
  else {
    input_error("STRSV ",local_3c);
  }
  return;
}

Assistant:

void strsv_(char *uplo, char *trans, char *diag, integer *n, 
	real *a, integer *lda, real *x, integer *incx)
{


    /* System generated locals */

    /* Local variables */
    integer info;
    real temp;
    integer i, j;
    integer ix, jx, kx;
    logical nounit;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    STRSV  solves one of the systems of equations   

       A*x = b,   or   A'*x = b,   

    where b and x are n element vectors and A is an n by n unit, or   
    non-unit, upper or lower triangular matrix.   

    No test for singularity or near-singularity is included in this   
    routine. Such tests must be performed before calling this routine.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the matrix is an upper or   
             lower triangular matrix as follows:   

                UPLO = 'U' or 'u'   A is an upper triangular matrix.   

                UPLO = 'L' or 'l'   A is a lower triangular matrix.   

             Unchanged on exit.   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the equations to be solved as   
             follows:   

                TRANS = 'N' or 'n'   A*x = b.   

                TRANS = 'T' or 't'   A'*x = b.   

                TRANS = 'C' or 'c'   A'*x = b.   

             Unchanged on exit.   

    DIAG   - CHARACTER*1.   
             On entry, DIAG specifies whether or not A is unit   
             triangular as follows:   

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.   

                DIAG = 'N' or 'n'   A is not assumed to be unit   
                                    triangular.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    A      - REAL             array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular matrix and the strictly lower triangular part of 
  
             A is not referenced.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular matrix and the strictly upper triangular part of 
  
             A is not referenced.   
             Note that when  DIAG = 'U' or 'u', the diagonal elements of 
  
             A are not referenced either, but are assumed to be unity.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   

    X      - REAL             array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element right-hand side vector b. On exit, X is overwritten 
  
             with the solution vector x.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   

       Test the input parameters.   
    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
		strncmp(trans, "C", 1)!=0 ) {
	info = 2;
    } else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 ) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,*n)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    }
    if (info != 0) {
	input_error("STRSV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return;
    }

    nounit = (strncmp(diag, "N", 1)==0);

/*     Set up the start point in X if the increment is not unity. This   
       will be  ( N - 1 )*INCX  too small for descending loops. */

    if (*incx <= 0) {
	kx = 1 - (*n - 1) * *incx;
    } else if (*incx != 1) {
	kx = 1;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */

    if (strncmp(trans, "N", 1)==0) {

/*        Form  x := inv( A )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    if (X(j) != 0.f) {
			if (nounit) {
			    X(j) /= A(j,j);
			}
			temp = X(j);
			for (i = j - 1; i >= 1; --i) {
			    X(i) -= temp * A(i,j);
/* L10: */
			}
		    }
/* L20: */
		}
	    } else {
		jx = kx + (*n - 1) * *incx;
		for (j = *n; j >= 1; --j) {
		    if (X(jx) != 0.f) {
			if (nounit) {
			    X(jx) /= A(j,j);
			}
			temp = X(jx);
			ix = jx;
			for (i = j - 1; i >= 1; --i) {
			    ix -= *incx;
			    X(ix) -= temp * A(i,j);
/* L30: */
			}
		    }
		    jx -= *incx;
/* L40: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    if (X(j) != 0.f) {
			if (nounit) {
			    X(j) /= A(j,j);
			}
			temp = X(j);
			for (i = j + 1; i <= *n; ++i) {
			    X(i) -= temp * A(i,j);
/* L50: */
			}
		    }
/* L60: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    if (X(jx) != 0.f) {
			if (nounit) {
			    X(jx) /= A(j,j);
			}
			temp = X(jx);
			ix = jx;
			for (i = j + 1; i <= *n; ++i) {
			    ix += *incx;
			    X(ix) -= temp * A(i,j);
/* L70: */
			}
		    }
		    jx += *incx;
/* L80: */
		}
	    }
	}
    } else {

/*        Form  x := inv( A' )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    temp = X(j);
		    for (i = 1; i <= j-1; ++i) {
			temp -= A(i,j) * X(i);
/* L90: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(j) = temp;
/* L100: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    temp = X(jx);
		    ix = kx;
		    for (i = 1; i <= j-1; ++i) {
			temp -= A(i,j) * X(ix);
			ix += *incx;
/* L110: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(jx) = temp;
		    jx += *incx;
/* L120: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    temp = X(j);
		    for (i = *n; i >= j+1; --i) {
			temp -= A(i,j) * X(i);
/* L130: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(j) = temp;
/* L140: */
		}
	    } else {
		kx += (*n - 1) * *incx;
		jx = kx;
		for (j = *n; j >= 1; --j) {
		    temp = X(jx);
		    ix = kx;
		    for (i = *n; i >= j+1; --i) {
			temp -= A(i,j) * X(ix);
			ix -= *incx;
/* L150: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(jx) = temp;
		    jx -= *incx;
/* L160: */
		}
	    }
	}
    }

    return;

/*     End of STRSV . */

}